

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_footer_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  string footer;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)&app->footer_);
  if (local_30._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    ::std::operator+(__return_storage_ptr__,&local_30,"\n");
  }
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(!footer.empty())
        return footer + "\n";
    else
        return "";
}